

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_date.cpp
# Opt level: O3

bool ON_GetGregorianMonthAndDayOfMonth(uint year,uint day_of_year,uint *month,uint *date)

{
  uint uVar1;
  uint uVar2;
  long lVar3;
  undefined1 *puVar4;
  
  uVar1 = 0;
  if (0x62d < year) {
    if (((year & 3) != 0 || year < 0x658) ||
       ((puVar4 = LeapYearDayCount()::leap_year_day_count,
        0xa3d70a < (year * -0x3d70a3d7 >> 4 | year * -0x70000000) && (year == (year / 100) * 100))))
    {
      puVar4 = CommonYearDayCount()::common_year_day_count;
    }
    lVar3 = 1;
    do {
      if (day_of_year <= *(uint *)(puVar4 + lVar3 * 4)) {
        uVar1 = day_of_year - *(int *)(puVar4 + lVar3 * 4 + -4);
        uVar2 = (uint)lVar3;
        if (uVar1 == 0) {
          uVar2 = 0;
        }
        goto LAB_00432c5d;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xd);
  }
  uVar2 = 0;
LAB_00432c5d:
  if (month != (uint *)0x0) {
    *month = uVar2;
  }
  if (date != (uint *)0x0) {
    *date = uVar1;
  }
  return uVar1 != 0;
}

Assistant:

bool ON_GetGregorianMonthAndDayOfMonth(
  unsigned int year,
  unsigned int day_of_year,
  unsigned int* month,
  unsigned int* date
  )
{
  unsigned int mm = 0;
  unsigned int dd = 0;
  if( year >= FIRST_GREGORIAN_YEAR )
  {
    const unsigned int* year_day_count = YearDayCount(year);
    for ( mm = 1; mm <= 12; mm++ )
    {
      if ( day_of_year <= year_day_count[mm] )
      {
        dd = day_of_year - year_day_count[mm-1];
        break;
      }
    }
    if ( 0 == dd )
      mm = dd;
  }

  if ( 0 != month )
    *month = mm;

  if ( 0 != date )
    *date = dd;

  return (0 != dd);
}